

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O2

void __thiscall SimpleVendor::SimpleVendor(SimpleVendor *this,int argc,char **argv,VendorIo *io)

{
  bool bVar1;
  invalid_argument *this_00;
  
  Vendor::Vendor(&this->super_Vendor,argc,argv);
  (this->super_Vendor)._vptr_Vendor = (_func_int **)&PTR_ValidatePrice_00180fe8;
  this->vio = io;
  if ((this->super_Vendor).kPrice != 0) {
    bVar1 = ValidatePrice(this);
    io = this->vio;
    if (bVar1) {
      (*io->_vptr_VendorIo[6])(io,(ulong)(uint)(this->super_Vendor).kPrice);
      return;
    }
  }
  (*io->_vptr_VendorIo[1])(io,*argv);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid price");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

SimpleVendor::SimpleVendor(int argc, char **argv, VendorIo *io) : vio(io), Vendor(argc, argv) {
    if (GetPrice() == 0 || !ValidatePrice()) {
        vio->PrintUsage(argv[0]);
        throw invalid_argument("invalid price");
    }
    vio->PrintWelcomeMessage(GetPrice());
}